

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

token * dmrC_preprocess(dmr_C *C,token *token)

{
  token *ptVar1;
  position pVar2;
  int iVar3;
  uint uVar4;
  symbol *psVar5;
  token **list;
  long lVar6;
  stream *stream;
  token *local_40;
  token *token_local;
  
  C->preprocessing = 1;
  local_40 = token;
  iVar3 = dmrC_init_stream(C,"preprocessor",-1,C->includepath);
  lVar6 = 8;
  do {
    ptVar1 = *(token **)((long)&init_preprocessor_normal + lVar6);
    psVar5 = dmrC_create_symbol(C->S,iVar3,*(char **)(&UNK_0014a1e8 + lVar6),1,0x40);
    (psVar5->field_14).field_0.expansion = ptVar1;
    (psVar5->field_14).field_1.normal = 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x128);
  lVar6 = 8;
  do {
    ptVar1 = *(token **)((long)&init_preprocessor_special + lVar6);
    psVar5 = dmrC_create_symbol(C->S,iVar3,
                                *(char **)((long)&PTR_handle_argv_include_0014a308 + lVar6),1,0x40);
    (psVar5->field_14).field_0.expansion = ptVar1;
    (psVar5->field_14).field_1.normal = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x68);
  C->counter_macro = 0;
  token_local = (token *)&C->token_allocator;
  list = &local_40;
  do {
    if (((ulong)token->pos & 0x3f) == 0x19) {
      do {
        (token->field_2).number[0x11] = (token->field_2).number[0x11] & 0xfe;
        token = token->next;
      } while (((ulong)token->pos & 0x3f) == 0x19);
      *list = token;
    }
    if (token == &dmrC_eof_token_entry_) {
      C->preprocessing = 0;
      return local_40;
    }
    pVar2 = token->pos;
    stream = (stream *)
             ((long)&C->T->input_streams->fd + (ulong)(((uint)((ulong)pVar2 >> 6) & 0x3fff) * 0x48))
    ;
    if ((((pVar2._0_4_ & 0x10003f) == 0x100011) && (-1 < (long)pVar2)) &&
       ((token->field_2).special == 0x23)) {
      preprocessor_line(C,stream,list);
LAB_0011ee37:
      dmrC_allocator_free((allocator *)token_local,token);
    }
    else {
      uVar4 = pVar2._0_4_ & 0x3f;
      if (uVar4 != 0x12) {
        if (uVar4 != 0x13) {
          if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
            stream->protect = (ident *)0x0;
          }
          if (C->false_nesting != 0) {
            *list = token->next;
            goto LAB_0011ee37;
          }
          if (((ulong)token->pos & 0x3f) == 2) {
            iVar3 = expand_one_symbol(C,list);
            if (iVar3 == 0) goto LAB_0011ee43;
          }
          list = &token->next;
          goto LAB_0011ee43;
        }
        if (stream->top_if != (token *)0x0) {
          stream->dirty = 1;
          stream->protect = (ident *)0x0;
          stream->ifndef = (token *)0x0;
          dmrC_sparse_error(C,stream->top_if->pos,"unterminated preprocessor conditional");
          stream->top_if = (token *)0x0;
          C->false_nesting = 0;
        }
        if (stream->dirty == 0) {
          stream->constant = CONSTANT_FILE_YES;
        }
      }
      *list = token->next;
    }
LAB_0011ee43:
    token = *list;
  } while( true );
}

Assistant:

struct token * dmrC_preprocess(struct dmr_C *C, struct token *token)
{
	C->preprocessing = 1;
	init_preprocessor(C);
	do_preprocess(C, &token);

	// Drop all expressions from preprocessing, they're not used any more.
	// This is not true when we have multiple files, though ;/
	// clear_expression_alloc();
	C->preprocessing = 0;

	return token;
}